

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

TValue * cpluaopen(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint uVar1;
  ulong uVar2;
  GCtab *pGVar3;
  GCstr *pGVar4;
  size_t lenx;
  undefined8 *puVar5;
  uint8_t uVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  char *pcVar10;
  size_t lenx_00;
  long lVar11;
  
  uVar2 = (ulong)(L->glref).ptr32;
  stack_init(L,L);
  uVar7 = 0;
  pGVar3 = lj_tab_new(L,0,6);
  (L->env).gcptr32 = (uint32_t)pGVar3;
  uVar9 = (ulong)(L->glref).ptr32;
  pGVar3 = lj_tab_new(L,0,2);
  *(int *)(uVar9 + 0x98) = (int)pGVar3;
  *(undefined4 *)(uVar9 + 0x9c) = 0xfffffff4;
  lj_str_resize(L,0xff);
  uVar1 = (L->glref).ptr32;
  pcVar10 = 
  "__index__newindex__gc__mode__eq__len__lt__le__concat__call__add__sub__mul__div__mod__pow__unm__metatable__tostring__new__pairs__ipairs"
  ;
  cVar8 = '_';
  while (cVar8 != '\0') {
    lenx_00 = 2;
    while( true ) {
      cVar8 = pcVar10[lenx_00];
      if ((cVar8 == '\0') || (cVar8 == '_')) break;
      lenx_00 = lenx_00 + 1;
    }
    pGVar4 = lj_str_new(L,pcVar10,lenx_00);
    *(int *)((ulong)uVar1 + 0x100 + uVar7 * 4) = (int)pGVar4;
    uVar7 = (ulong)((int)uVar7 + 1);
    pcVar10 = pcVar10 + lenx_00;
  }
  uVar6 = '\x01';
  for (lVar11 = 0; lVar11 != 0xb0; lVar11 = lVar11 + 8) {
    pcVar10 = *(char **)((long)tokennames + lVar11);
    lenx = strlen(pcVar10);
    pGVar4 = lj_str_new(L,pcVar10,lenx);
    pGVar4->marked = pGVar4->marked | 0x20;
    pGVar4->reserved = uVar6;
    uVar6 = uVar6 + '\x01';
  }
  pGVar4 = lj_err_str(L,LJ_ERR_ERRMEM);
  pGVar4->marked = pGVar4->marked | 0x20;
  *(int *)(uVar2 + 0x24) = *(int *)(uVar2 + 0x20) << 2;
  puVar5 = (undefined8 *)(uVar2 + 0x27f & 0xfffffffffffffff0);
  *puVar5 = 0x7fffffffffffffff;
  puVar5[1] = 0x7fffffffffffffff;
  puVar5 = (undefined8 *)(uVar2 + 0x28f & 0xfffffffffffffff0);
  *puVar5 = 0x8000000000000000;
  puVar5[1] = 0x8000000000000000;
  return (TValue *)0x0;
}

Assistant:

static TValue *cpluaopen(lua_State *L, lua_CFunction dummy, void *ud)
{
  global_State *g = G(L);
  UNUSED(dummy);
  UNUSED(ud);
  stack_init(L, L);
  /* NOBARRIER: State initialization, all objects are white. */
  setgcref(L->env, obj2gco(lj_tab_new(L, 0, LJ_MIN_GLOBAL)));
  settabV(L, registry(L), lj_tab_new(L, 0, LJ_MIN_REGISTRY));
  lj_str_resize(L, LJ_MIN_STRTAB-1);
  lj_meta_init(L);
  lj_lex_init(L);
  fixstring(lj_err_str(L, LJ_ERR_ERRMEM));  /* Preallocate memory error msg. */
  g->gc.threshold = 4*g->gc.total;
  lj_trace_initstate(g);
  return NULL;
}